

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void __thiscall MD5::update(MD5 *this,uchar *input,size_type length)

{
  uint uVar1;
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  size_type i;
  size_type firstpart;
  size_type index;
  uint1 *in_stack_00000038;
  MD5 *in_stack_00000040;
  undefined4 local_20;
  undefined4 local_18;
  
  local_18 = *(uint *)(in_RDI + 0x44) >> 3 & 0x3f;
  uVar1 = in_EDX * 8 + *(int *)(in_RDI + 0x44);
  *(uint *)(in_RDI + 0x44) = uVar1;
  if (uVar1 < in_EDX << 3) {
    *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + 1;
  }
  *(uint *)(in_RDI + 0x48) = (in_EDX >> 0x1d) + *(int *)(in_RDI + 0x48);
  local_20 = 0x40 - local_18;
  if (in_EDX < local_20) {
    local_20 = 0;
  }
  else {
    memcpy((void *)(in_RDI + 1 + (ulong)local_18),in_RSI,(ulong)local_20);
    transform(in_stack_00000040,in_stack_00000038);
    for (; local_20 + 0x40 <= in_EDX; local_20 = local_20 + 0x40) {
      transform(in_stack_00000040,in_stack_00000038);
    }
    local_18 = 0;
  }
  memcpy((void *)(in_RDI + 1 + (ulong)local_18),(void *)((long)in_RSI + (ulong)local_20),
         (ulong)(in_EDX - local_20));
  return;
}

Assistant:

void MD5::update(const unsigned char input[], size_type length)
{
  // compute number of bytes mod 64
  size_type index = count[0] / 8 % blocksize;
 
  // Update number of bits
  if ((count[0] += (length << 3)) < (length << 3))
    count[1]++;
  count[1] += (length >> 29);
 
  // number of bytes we need to fill in buffer
  size_type firstpart = 64 - index;
 
  size_type i;
 
  // transform as many times as possible.
  if (length >= firstpart)
  {
    // fill buffer first, transform
    memcpy(&buffer[index], input, firstpart);
    transform(buffer);
 
    // transform chunks of blocksize (64 bytes)
    for (i = firstpart; i + blocksize <= length; i += blocksize)
      transform(&input[i]);
 
    index = 0;
  }
  else
    i = 0;
 
  // buffer remaining input
  memcpy(&buffer[index], &input[i], length-i);
}